

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O1

uintwide_t<128U,_unsigned_short,_void,_false>
test_uintwide_t_edge::
generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
          (bool is_positive,local_base base_to_get,int digits_in_base_to_get)

{
  char __c;
  bool bVar1;
  result_type rVar2;
  string str_x;
  local_base local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  array<unsigned_short,_8UL> local_38;
  
  local_5c = base_to_get;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_58,(long)digits_in_base_to_get,'0');
  std::
  generate<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,test_uintwide_t_edge::generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>(bool,test_uintwide_t_edge::local_base,int)::_lambda()_1_>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_58._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_58._M_dataplus._M_p + local_58._M_string_length),
             (anon_class_8_1_a530db20)&local_5c);
  if (local_5c == hex) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_58,0,0,1,'x');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_58,0,0,1,'0');
  }
  else if (local_5c == oct) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_58,0,0,1,'0');
  }
  if (local_5c == dec) {
    __c = '+';
    if (!is_positive) {
      rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&dist_sgn,
                         (discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
                          *)&eng_sgn,(param_type *)&dist_sgn);
      __c = (rVar2 == 0) * '\x02' + '+';
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_58,0,0,1,__c);
  }
  local_38.elems[0] = 0;
  local_38.elems[1] = 0;
  local_38.elems[2] = 0;
  local_38.elems[3] = 0;
  local_38.elems[4] = 0;
  local_38.elems[5] = 0;
  local_38.elems[6] = 0;
  local_38.elems[7] = 0;
  bVar1 = math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_false>::rd_string
                    ((uintwide_t<128U,_unsigned_short,_void,_false> *)&local_38,
                     local_58._M_dataplus._M_p,0xffffffffffffffff,0);
  if (!bVar1) {
    local_38.elems[4] = 0xffff;
    local_38.elems[5] = 0xffff;
    local_38.elems[0] = 0xffff;
    local_38.elems[1] = 0xffff;
    local_38.elems[2] = 0xffff;
    local_38.elems[3] = 0xffff;
    local_38.elems[6] = 0xffff;
    local_38.elems[7] = 0xffff;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (representation_type)(representation_type)local_38.elems;
}

Assistant:

auto generate_wide_integer_value(bool       is_positive           = true,
                                 local_base base_to_get           = local_base::dec,
                                 int        digits_in_base_to_get = std::numeric_limits<IntegralTypeWithStringConstruction>::digits10) -> IntegralTypeWithStringConstruction
{
  using local_integral_type = IntegralTypeWithStringConstruction;

  static_assert(   (  std::numeric_limits<local_integral_type>::is_signed  && std::numeric_limits<local_integral_type>::digits > static_cast<int>(INT8_C(63)))
                || ((!std::numeric_limits<local_integral_type>::is_signed) && std::numeric_limits<local_integral_type>::digits > static_cast<int>(INT8_C(64))),
                "Error: Integral type destination does not have enough digits10");

  std::string str_x(static_cast<std::size_t>(digits_in_base_to_get), '0');

  std::generate(str_x.begin(),
                str_x.end(),
                [&base_to_get]() // NOLINT(modernize-use-trailing-return-type,-warnings-as-errors)
                {
                  char c { };

                  if(base_to_get == local_base::oct)
                  {
                    c = static_cast<char>(dist_dig_oct(eng_dig));
                    c = static_cast<char>(c + '0');
                  }
                  else if(base_to_get == local_base::hex)
                  {
                    c = static_cast<char>(dist_dig_hex(eng_dig));

                    if(c < static_cast<char>(INT8_C(10)))
                    {
                      c = static_cast<char>(c + '0');
                    }
                    else
                    {
                      c =
                        static_cast<char>
                        (
                            static_cast<char>(c + 'A')
                          - static_cast<char>(INT8_C(10))
                        );
                    }
                  }
                  else
                  {
                    c = static_cast<char>(dist_dig_dec(eng_dig));
                    c = static_cast<char>(c + static_cast<char>(INT8_C(0x30)));
                  }

                  return c;
                });

  if(base_to_get == local_base::oct)
  {
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), '0');
  }
  else if(base_to_get == local_base::hex)
  {
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), 'x');
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), '0');
  }

  if(base_to_get == local_base::dec)
  {
    // Insert either a positive sign or a negative sign
    // (always one or the other) depending on the sign of x.
    const auto sign_char_to_insert =
      static_cast<char>
      (
        is_positive
          ? '+'
          : static_cast<char>((dist_sgn(eng_sgn) != static_cast<std::uint32_t>(UINT32_C(0))) ? '+' : '-') // NOLINT(readability-avoid-nested-conditional-operator)
      );

    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), sign_char_to_insert);
  }

  return local_integral_type(str_x.c_str());
}